

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O2

map_value map_remove(map m,map_key key)

{
  int iVar1;
  hash hVar2;
  undefined8 uVar3;
  char *pcVar4;
  map_value value;
  
  value = (map_value)0x0;
  if (m == (map)0x0 || key == (map_key)0x0) {
    pcVar4 = "Invalid map remove parameters";
    uVar3 = 0x135;
  }
  else {
    hVar2 = (*m->hash_cb)(key);
    iVar1 = bucket_remove(m->buckets + hVar2 % m->capacity,m->compare_cb,key,&value);
    if (iVar1 == 0) {
      m->count = m->count - 1;
      iVar1 = map_bucket_realloc(m);
      if (iVar1 == 0) {
        return value;
      }
      pcVar4 = "Invalid map bucket remove reallocation";
      uVar3 = 0x149;
    }
    else {
      pcVar4 = "Invalid map bucket remove: %p";
      uVar3 = 0x141;
    }
  }
  log_write_impl_va("metacall",uVar3,"map_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                    ,3,pcVar4);
  return (map_value)0x0;
}

Assistant:

map_value map_remove(map m, map_key key)
{
	map_hash h;
	size_t index;
	bucket b;
	map_value value = NULL;

	if (m == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map remove parameters");
		return NULL;
	}

	h = m->hash_cb(key);

	index = h % m->capacity;

	b = &m->buckets[index];

	if (bucket_remove(b, m->compare_cb, key, &value) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove: %p", key);
		return NULL;
	}

	--m->count;

	if (map_bucket_realloc(m) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map bucket remove reallocation");
		return NULL;
	}

	return value;
}